

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O3

Var Js::CrossSite::ProfileThunk(RecyclableObject *callable,CallInfo callInfo,...)

{
  ScriptContext *this;
  FunctionInfo *pFVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptFunction *obj;
  undefined4 *puVar4;
  JavascriptMethod p_Var5;
  HostScriptContext *requestHostScriptContext;
  ScriptFunction *this_00;
  ProxyEntryPointInfo *pPVar6;
  char16 *pcVar7;
  Var pvVar8;
  code *pcVar9;
  int in_stack_00000010;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  obj = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(callable);
  if (((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->typeId != TypeIds_Function) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x171,"(function->GetTypeId() == TypeIds_Function)",
                                "function->GetTypeId() == TypeIds_Function");
    if (!bVar2) goto LAB_00756c35;
    *puVar4 = 0;
  }
  p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)obj);
  if (p_Var5 != ProfileThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x172,"(function->GetEntryPoint() == CrossSite::ProfileThunk)",
                                "function->GetEntryPoint() == CrossSite::ProfileThunk");
    if (!bVar2) goto LAB_00756c35;
    *puVar4 = 0;
  }
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x173,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
LAB_00756c35:
      pcVar9 = (code *)invalidInstructionException();
      (*pcVar9)();
    }
    *puVar4 = 0;
  }
  this = (((((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
  BVar3 = RecyclableObject::IsExternal((RecyclableObject *)obj);
  requestHostScriptContext = ThreadContext::GetPreviousHostScriptContext(this->threadContext);
  ScriptContext::VerifyAliveWithHostContext(this,(uint)(BVar3 == 0),requestHostScriptContext);
  pFVar1 = (obj->functionInfo).ptr;
  bVar2 = VarIs<Js::WasmScriptFunction,Js::JavascriptFunction>(obj);
  if (bVar2) {
    pcVar9 = AsmJsExternalEntryPoint;
  }
  else if ((pFVar1->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
    pcVar9 = ScriptContext::DebugProfileProbeThunk;
  }
  else {
    this_00 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    pPVar6 = ScriptFunction::GetEntryPointInfo(this_00);
    pcVar9 = pPVar6->jsMethod;
    pcVar7 = FunctionProxy::GetDebugNumberSet
                       ((pFVar1->functionBodyImpl).ptr,(wchar (*) [42])local_98);
    Output::Trace(ScriptProfilerPhase,
                  L"CrossSite::ProfileThunk FunctionNumber : %s, Entrypoint : 0x%08X\n",pcVar7,
                  pcVar9);
  }
  unique0x1000031c = callInfo;
  pvVar8 = CommonThunk((RecyclableObject *)obj,pcVar9,(Arguments *)(debugStringBuffer + 0x28));
  return pvVar8;
}

Assistant:

Var CrossSite::ProfileThunk(RecyclableObject* callable, CallInfo callInfo, ...)
    {
        JavascriptFunction* function = VarTo<JavascriptFunction>(callable);
        Assert(function->GetTypeId() == TypeIds_Function);
        Assert(function->GetEntryPoint() == CrossSite::ProfileThunk);
        RUNTIME_ARGUMENTS(args, callInfo);
        ScriptContext * scriptContext = function->GetScriptContext();
        // It is not safe to access the function body if the script context is not alive.
        scriptContext->VerifyAliveWithHostContext(!function->IsExternal(),
            scriptContext->GetThreadContext()->GetPreviousHostScriptContext());

        JavascriptMethod entryPoint;
        FunctionInfo *funcInfo = function->GetFunctionInfo();

        TTD_XSITE_LOG(callable->GetScriptContext(), "DefaultOrProfileThunk", callable);

#ifdef ENABLE_WASM
        if (VarIs<WasmScriptFunction>(function))
        {
            entryPoint = Js::AsmJsExternalEntryPoint;
        } else
#endif
        if (funcInfo->HasBody())
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            entryPoint = VarTo<ScriptFunction>(function)->GetEntryPointInfo()->jsMethod;
            if (funcInfo->IsDeferred() && scriptContext->IsProfiling())
            {
                // if the current entrypoint is deferred parse we need to update it appropriately for the profiler mode.
                entryPoint = Js::ScriptContext::GetProfileModeThunk(entryPoint);
            }
            OUTPUT_TRACE(Js::ScriptProfilerPhase, _u("CrossSite::ProfileThunk FunctionNumber : %s, Entrypoint : 0x%08X\n"), funcInfo->GetFunctionProxy()->GetDebugNumberSet(debugStringBuffer), entryPoint);
        }
        else
        {
            entryPoint = ProfileEntryThunk;
        }


        return CommonThunk(function, entryPoint, args);
    }